

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_L_upper.c
# Opt level: O0

void test_option_L_upper(void)

{
  wchar_t wVar1;
  FILE *__stream;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  int r;
  FILE *filelist;
  char *in_stack_00000018;
  undefined4 in_stack_00000020;
  wchar_t in_stack_00000024;
  char *in_stack_00000028;
  wchar_t in_stack_00000084;
  char *in_stack_00000088;
  wchar_t in_stack_00000094;
  char *in_stack_00000098;
  char *in_stack_00000498;
  wchar_t in_stack_000004a4;
  char *in_stack_000004a8;
  char *in_stack_ffffffffffffffe8;
  char *pcVar2;
  undefined4 in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff4;
  
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_L_upper.c"
                   ,L'+');
    test_skipping("Symlink tests");
  }
  else {
    __stream = fopen("filelist","w");
    assertion_make_file(in_stack_00000028,in_stack_00000024,in_stack_00000018,filelist._4_4_,
                        (wchar_t)filelist,in_stack_00000008);
    fprintf(__stream,"file\n");
    assertion_make_symlink
              ((char *)__stream,in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8,(char *)0x110086
              );
    fprintf(__stream,"symlink\n");
    fclose(__stream);
    wVar1 = systemf("cat filelist | %s -pd copy >copy.out 2>copy.err",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__stream,
                        (char *)CONCAT44(wVar1,in_stack_fffffffffffffff0),0,(char *)0x1100f0,
                        (void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_text_file_contents
              (in_stack_00000028,in_stack_00000024,in_stack_00000018,
               (char *)CONCAT44(filelist._4_4_,(wchar_t)filelist));
    failure("Regular -p without -L should preserve symlinks.");
    assertion_is_symlink((char *)__stream,wVar1,pcVar2,(char *)0x110139);
    wVar1 = systemf("cat filelist | %s -pd -L copy-L >copy-L.out 2>copy-L.err",testprog);
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__stream,
                        (char *)CONCAT44(wVar1,in_stack_fffffffffffffff0),0,(char *)0x110186,
                        (void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    assertion_text_file_contents
              (in_stack_00000028,in_stack_00000024,in_stack_00000018,
               (char *)CONCAT44(filelist._4_4_,(wchar_t)filelist));
    failure("-pdL should dereference symlinks and turn them into files.");
    assertion_is_reg(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000084);
    wVar1 = systemf("cat filelist | %s -o >archive.out 2>archive.err",testprog);
    failure("Error invoking %s -o ",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__stream,
                        (char *)CONCAT44(wVar1,in_stack_fffffffffffffff0),0,(char *)0x11024d,
                        (void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_text_file_contents
              (in_stack_00000028,in_stack_00000024,in_stack_00000018,
               (char *)CONCAT44(filelist._4_4_,(wchar_t)filelist));
    assertion_make_dir((char *)__stream,wVar1,pcVar2,L'\0');
    assertion_chdir((char *)__stream,wVar1,pcVar2);
    wVar1 = systemf("cat ../archive.out | %s -i >unpack.out 2>unpack.err",testprog);
    failure("Error invoking %s -i",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__stream,
                        (char *)CONCAT44(wVar1,in_stack_fffffffffffffff0),0,(char *)0x110306,
                        (void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_text_file_contents
              (in_stack_00000028,in_stack_00000024,in_stack_00000018,
               (char *)CONCAT44(filelist._4_4_,(wchar_t)filelist));
    assertion_chdir((char *)__stream,wVar1,pcVar2);
    assertion_is_symlink((char *)__stream,wVar1,pcVar2,(char *)0x110359);
    wVar1 = systemf("cat filelist | %s -oL >archive-L.out 2>archive-L.err",testprog);
    failure("Error invoking %s -oL",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__stream,
                        (char *)CONCAT44(wVar1,in_stack_fffffffffffffff0),0,(char *)0x1103be,
                        (void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_text_file_contents
              (in_stack_00000028,in_stack_00000024,in_stack_00000018,
               (char *)CONCAT44(filelist._4_4_,(wchar_t)filelist));
    assertion_make_dir((char *)__stream,wVar1,pcVar2,L'\0');
    assertion_chdir((char *)__stream,wVar1,pcVar2);
    wVar1 = systemf("cat ../archive-L.out | %s -i >unpack-L.out 2>unpack-L.err",testprog);
    failure("Error invoking %s -i < archive-L.out",testprog);
    pcVar2 = (char *)0x0;
    assertion_equal_int(in_stack_00000008,unaff_retaddr,(longlong)__stream,
                        (char *)CONCAT44(wVar1,in_stack_fffffffffffffff0),0,(char *)0x110477,
                        (void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_text_file_contents
              (in_stack_00000028,in_stack_00000024,in_stack_00000018,
               (char *)CONCAT44(filelist._4_4_,(wchar_t)filelist));
    assertion_chdir((char *)__stream,wVar1,pcVar2);
    assertion_is_reg(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000084);
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_L_upper)
{
	FILE *filelist;
	int r;

	if (!canSymlink()) {
		skipping("Symlink tests");
		return;
	}

	filelist = fopen("filelist", "w");

	/* Create a file and a symlink to the file. */
	assertMakeFile("file", 0644, "1234567890");
	fprintf(filelist, "file\n");

	/* Symlink to above file. */
	assertMakeSymlink("symlink", "file");
	fprintf(filelist, "symlink\n");

	fclose(filelist);

	r = systemf(CAT " filelist | %s -pd copy >copy.out 2>copy.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "copy.err");

	failure("Regular -p without -L should preserve symlinks.");
	assertIsSymlink("copy/symlink", NULL);

	r = systemf(CAT " filelist | %s -pd -L copy-L >copy-L.out 2>copy-L.err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("copy-L.out");
	assertTextFileContents("1 block\n", "copy-L.err");
	failure("-pdL should dereference symlinks and turn them into files.");
	assertIsReg("copy-L/symlink", -1);

	r = systemf(CAT " filelist | %s -o >archive.out 2>archive.err", testprog);
	failure("Error invoking %s -o ", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "archive.err");

	assertMakeDir("unpack", 0755);
	assertChdir("unpack");
	r = systemf(CAT " ../archive.out | %s -i >unpack.out 2>unpack.err", testprog);
	failure("Error invoking %s -i", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "unpack.err");
	assertChdir("..");

	assertIsSymlink("unpack/symlink", NULL);

	r = systemf(CAT " filelist | %s -oL >archive-L.out 2>archive-L.err", testprog);
	failure("Error invoking %s -oL", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "archive-L.err");

	assertMakeDir("unpack-L", 0755);
	assertChdir("unpack-L");
	r = systemf(CAT " ../archive-L.out | %s -i >unpack-L.out 2>unpack-L.err", testprog);
	failure("Error invoking %s -i < archive-L.out", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "unpack-L.err");
	assertChdir("..");
	assertIsReg("unpack-L/symlink", -1);
}